

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O2

bool __thiscall
cmArchiveWrite::Add(cmArchiveWrite *this,string *path,size_t skip,char *prefix,bool recursive)

{
  size_type sVar1;
  pointer path_00;
  
  path_00 = (path->_M_dataplus)._M_p;
  sVar1 = path->_M_string_length;
  if ((sVar1 != 0) && (path_00[sVar1 - 1] == '/')) {
    std::__cxx11::string::erase((ulong)path,sVar1 - 1);
    path_00 = (path->_M_dataplus)._M_p;
  }
  AddPath(this,path_00,skip,prefix,recursive);
  return (this->Error)._M_string_length == 0;
}

Assistant:

bool cmArchiveWrite::Add(std::string path, size_t skip, const char* prefix,
                         bool recursive)
{
  if (!path.empty() && path.back() == '/') {
    path.erase(path.size() - 1);
  }
  this->AddPath(path.c_str(), skip, prefix, recursive);
  return this->Okay();
}